

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

bool __thiscall Map::testConnected(Map *this)

{
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *this_00;
  Continent *this_01;
  bool bVar1;
  reference ppCVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  size_type sVar4;
  Continent *continent;
  iterator __end2;
  iterator __begin2;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *__range2;
  Map *this_local;
  
  bVar1 = testIndividualGraph(this->pMapCountries,false);
  if (bVar1) {
    this_00 = this->pMapContinents;
    __end2 = std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::begin(this_00);
    continent = (Continent *)
                std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
                                       *)&continent), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
                ::operator*(&__end2);
      this_01 = *ppCVar2;
      pvVar3 = Continent::getCountriesInContinent(this_01);
      sVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
      if (sVar4 != 1) {
        pvVar3 = Continent::getCountriesInContinent(this_01);
        bVar1 = testIndividualGraph(pvVar3,true);
        if (!bVar1) {
          return false;
        }
      }
      __gnu_cxx::
      __normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Map::testConnected() {
    //test overall graph
    if(testIndividualGraph(this->pMapCountries,false)){
        //test subgraphs
        for(auto continent : *this->pMapContinents){
            if(continent->getCountriesInContinent()->size() == 1){
                continue;
            }else if(!testIndividualGraph(continent->getCountriesInContinent(),true)){
                return false;
            }
        }
        return true;
    }
    return false;
}